

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWArray.h
# Opt level: O3

void __thiscall
COLLADAFW::Array<COLLADAFW::UniqueId>::cloneArray
          (Array<COLLADAFW::UniqueId> *this,Array<COLLADAFW::UniqueId> *clonedArray)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  UniqueId *pUVar3;
  UniqueId *pUVar4;
  undefined8 uVar5;
  size_t sVar6;
  long lVar7;
  
  allocMemory(clonedArray,this->mCapacity,1);
  sVar6 = this->mCount;
  clonedArray->mCount = sVar6;
  if (sVar6 != 0) {
    lVar7 = 0;
    do {
      pUVar3 = this->mData;
      pUVar4 = clonedArray->mData;
      *(undefined8 *)((long)&pUVar4->mFileId + lVar7) =
           *(undefined8 *)((long)&pUVar3->mFileId + lVar7);
      puVar1 = (undefined8 *)((long)&pUVar3->mClassId + lVar7);
      uVar5 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pUVar4->mClassId + lVar7);
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
      lVar7 = lVar7 + 0x18;
      sVar6 = sVar6 - 1;
    } while (sVar6 != 0);
  }
  return;
}

Assistant:

void cloneArray( Array<Type>& clonedArray ) const
		{
			clonedArray.allocMemory(getCapacity());
			size_t count = getCount();
			clonedArray.setCount(count);
			for ( size_t i = 0; i < count; ++i)
				clonedArray[i] = (*this)[i];
		}